

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_PackFontRanges
              (stbtt_pack_context *spc,uchar *fontdata,int font_index,stbtt_pack_range *ranges,
              int num_ranges)

{
  int iVar1;
  stbtt_packedchar *psVar2;
  undefined8 data2;
  int iVar3;
  stbrp_rect *rects;
  ulong uVar4;
  long lVar5;
  size_t __size;
  undefined1 local_78 [8];
  stbtt_fontinfo info;
  
  iVar3 = 0;
  if (num_ranges < 1) {
    __size = 0;
  }
  else {
    uVar4 = 0;
    do {
      iVar1 = ranges[uVar4].num_chars;
      if (0 < (long)iVar1) {
        psVar2 = ranges[uVar4].chardata_for_range;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&psVar2->x0 + lVar5) = 0;
          lVar5 = lVar5 + 0x1c;
        } while ((long)iVar1 * 0x1c != lVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)num_ranges);
    __size = 0;
    if (0 < num_ranges) {
      lVar5 = 0;
      do {
        __size = (long)(int)__size + (long)*(int *)((long)&ranges->num_chars + lVar5);
        lVar5 = lVar5 + 0x28;
      } while ((ulong)(uint)num_ranges * 0x28 != lVar5);
      __size = __size * 0x18;
    }
  }
  info._48_8_ = fontdata;
  rects = (stbrp_rect *)malloc(__size);
  data2 = info._48_8_;
  if (rects != (stbrp_rect *)0x0) {
    local_78 = (undefined1  [8])spc->user_allocator_context;
    iVar3 = stbtt_GetFontOffsetForIndex((uchar *)info._48_8_,font_index);
    stbtt_InitFont((stbtt_fontinfo *)local_78,(uchar *)data2,iVar3);
    iVar3 = stbtt_PackFontRangesGatherRects(spc,(stbtt_fontinfo *)local_78,ranges,num_ranges,rects);
    stbtt_PackFontRangesPackRects(spc,rects,iVar3);
    iVar3 = stbtt_PackFontRangesRenderIntoRects
                      (spc,(stbtt_fontinfo *)local_78,ranges,num_ranges,rects);
    free(rects);
  }
  return iVar3;
}

Assistant:

STBTT_DEF int stbtt_PackFontRanges(stbtt_pack_context *spc, unsigned char *fontdata, int font_index, stbtt_pack_range *ranges, int num_ranges)
{
   stbtt_fontinfo info;
   int i,j,n, return_value = 1;
   //stbrp_context *context = (stbrp_context *) spc->pack_info;
   stbrp_rect    *rects;

   // flag all characters as NOT packed
   for (i=0; i < num_ranges; ++i)
      for (j=0; j < ranges[i].num_chars; ++j)
         ranges[i].chardata_for_range[j].x0 =
         ranges[i].chardata_for_range[j].y0 =
         ranges[i].chardata_for_range[j].x1 =
         ranges[i].chardata_for_range[j].y1 = 0;

   n = 0;
   for (i=0; i < num_ranges; ++i)
      n += ranges[i].num_chars;
         
   rects = (stbrp_rect *) STBTT_malloc(sizeof(*rects) * n, spc->user_allocator_context);
   if (rects == NULL)
      return 0;

   info.userdata = spc->user_allocator_context;
   stbtt_InitFont(&info, fontdata, stbtt_GetFontOffsetForIndex(fontdata,font_index));

   n = stbtt_PackFontRangesGatherRects(spc, &info, ranges, num_ranges, rects);

   stbtt_PackFontRangesPackRects(spc, rects, n);
  
   return_value = stbtt_PackFontRangesRenderIntoRects(spc, &info, ranges, num_ranges, rects);

   STBTT_free(rects, spc->user_allocator_context);
   return return_value;
}